

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hierarchy.c
# Opt level: O0

_Bool ecs_scope_next(ecs_iter_t *it)

{
  ecs_table_t *table_00;
  _Bool _Var1;
  int32_t iVar2;
  int32_t iVar3;
  undefined8 *puVar4;
  ecs_data_t *peVar5;
  ecs_entity_t *peVar6;
  ecs_data_t *data;
  ecs_table_t *table;
  int32_t i;
  int32_t count;
  ecs_filter_t filter;
  ecs_vector_t *tables;
  ecs_scope_iter_t *iter;
  ecs_iter_t *it_local;
  
  filter._16_8_ = (it->iter).parent.tables;
  _i = (it->iter).parent.filter.include;
  filter.include = (it->iter).parent.filter.exclude;
  filter.exclude = *(ecs_type_t *)&(it->iter).parent.filter.include_kind;
  iVar2 = ecs_vector_count((ecs_vector_t *)filter._16_8_);
  table._0_4_ = (it->iter).parent.index;
  while( true ) {
    if (iVar2 <= (int32_t)table) {
      return false;
    }
    puVar4 = (undefined8 *)_ecs_vector_get((ecs_vector_t *)filter._16_8_,8,0x10,(int32_t)table);
    table_00 = (ecs_table_t *)*puVar4;
    _ecs_assert(table_00 != (ecs_table_t *)0x0,0xc,(char *)0x0,"table != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                ,0x1b7);
    if (table_00 == (ecs_table_t *)0x0) break;
    peVar5 = ecs_table_get_data(table_00);
    if (peVar5 != (ecs_data_t *)0x0) {
      iVar3 = ecs_table_count(table_00);
      it->count = iVar3;
      if ((it->count != 0) &&
         (((_i == (ecs_type_t)0x0 && (filter.include == (ecs_type_t)0x0)) ||
          (_Var1 = ecs_table_match_filter(it->world,table_00,(ecs_filter_t *)&i), _Var1)))) {
        (it->iter).parent.table.table = table_00;
        it->table = (ecs_iter_table_t *)((long)&it->iter + 0x28);
        it->table_columns = peVar5->columns;
        iVar2 = ecs_table_count(table_00);
        it->count = iVar2;
        peVar6 = (ecs_entity_t *)_ecs_vector_first(peVar5->entities,8,0x10);
        it->entities = peVar6;
        (it->iter).parent.index = (int32_t)table + 1;
        return true;
      }
    }
    table._0_4_ = (int32_t)table + 1;
  }
  __assert_fail("table != ((void*)0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/hierarchy.c"
                ,0x1b7,"_Bool ecs_scope_next(ecs_iter_t *)");
}

Assistant:

bool ecs_scope_next(
    ecs_iter_t *it)
{
    ecs_scope_iter_t *iter = &it->iter.parent;
    ecs_vector_t *tables = iter->tables;
    ecs_filter_t filter = iter->filter;

    int32_t count = ecs_vector_count(tables);
    int32_t i;

    for (i = iter->index; i < count; i ++) {
        ecs_table_t *table = *ecs_vector_get(tables, ecs_table_t*, i);
        ecs_assert(table != NULL, ECS_INTERNAL_ERROR, NULL);

        ecs_data_t *data = ecs_table_get_data(table);
        if (!data) {
            continue;
        }

        it->count = ecs_table_count(table);
        if (!it->count) {
            continue;
        }

        if (filter.include || filter.exclude) {
            if (!ecs_table_match_filter(it->world, table, &filter)) {
                continue;
            }
        }

        iter->table.table = table;
        it->table = &iter->table;
        it->table_columns = data->columns;
        it->count = ecs_table_count(table);
        it->entities = ecs_vector_first(data->entities, ecs_entity_t);
        iter->index = i + 1;

        return true;
    }

    return false;    
}